

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::ObjCmp(SQVM *this,SQObjectPtr *o1,SQObjectPtr *o2,SQInteger *result)

{
  SQObjectValue *pSVar1;
  SQTable *pSVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  undefined1 local_60 [8];
  SQObjectPtr closure;
  undefined1 local_48 [8];
  SQObjectPtr res;
  SQObjectType t2;
  SQObjectType t1;
  SQInteger *result_local;
  SQObjectPtr *o2_local;
  SQObjectPtr *o1_local;
  SQVM *this_local;
  
  res.super_SQObject._unVal.nInteger._4_4_ = (o1->super_SQObject)._type;
  res.super_SQObject._unVal.fFloat = (SQFloat)(o2->super_SQObject)._type;
  if (res.super_SQObject._unVal.nInteger._4_4_ != res.super_SQObject._unVal.fFloat) {
    if ((((o1->super_SQObject)._type & 0x4000000) == 0) ||
       (((o2->super_SQObject)._type & 0x4000000) == 0)) {
      if ((SQFloat)res.super_SQObject._unVal.nInteger._4_4_ == 2.350989e-38) {
        *result = -1;
        this_local._7_1_ = 1;
      }
      else if (res.super_SQObject._unVal.fFloat == 2.350989e-38) {
        *result = 1;
        this_local._7_1_ = 1;
      }
      else {
        Raise_CompareError(this,&o1->super_SQObject,&o2->super_SQObject);
        this_local._7_1_ = 0;
      }
    }
    else if (((SQFloat)res.super_SQObject._unVal.nInteger._4_4_ == 6.0185325e-36) &&
            (res.super_SQObject._unVal.fFloat == 6.018534e-36)) {
      fVar6 = (float)(o1->super_SQObject)._unVal.nInteger;
      pSVar1 = &(o2->super_SQObject)._unVal;
      if ((fVar6 != pSVar1->fFloat) || (NAN(fVar6) || NAN(pSVar1->fFloat))) {
        if ((o2->super_SQObject)._unVal.fFloat <= (float)(o1->super_SQObject)._unVal.nInteger) {
          *result = 1;
          this_local._7_1_ = 1;
        }
        else {
          *result = -1;
          this_local._7_1_ = 1;
        }
      }
      else {
        *result = 0;
        this_local._7_1_ = 1;
      }
    }
    else {
      fVar6 = (o1->super_SQObject)._unVal.fFloat;
      fVar7 = (float)(o2->super_SQObject)._unVal.nInteger;
      if ((fVar6 != fVar7) || (NAN(fVar6) || NAN(fVar7))) {
        if ((float)(o2->super_SQObject)._unVal.nInteger <= (o1->super_SQObject)._unVal.fFloat) {
          *result = 1;
          this_local._7_1_ = 1;
        }
        else {
          *result = -1;
          this_local._7_1_ = 1;
        }
      }
      else {
        *result = 0;
        this_local._7_1_ = 1;
      }
    }
    goto LAB_00138f64;
  }
  if ((o1->super_SQObject)._unVal.pTable == (o2->super_SQObject)._unVal.pTable) {
    *result = 0;
    this_local._7_1_ = 1;
    goto LAB_00138f64;
  }
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_48);
  if (res.super_SQObject._unVal.nInteger._4_4_ == 0x5000002) {
    iVar4 = 1;
    if ((o1->super_SQObject)._unVal.nInteger < (o2->super_SQObject)._unVal.nInteger) {
      iVar4 = -1;
    }
    *result = (long)iVar4;
    this_local._7_1_ = 1;
    closure.super_SQObject._unVal.nInteger._4_4_ = 1;
  }
  else if (res.super_SQObject._unVal.nInteger._4_4_ == 0x5000004) {
    iVar4 = 1;
    if ((o1->super_SQObject)._unVal.fFloat < (o2->super_SQObject)._unVal.fFloat) {
      iVar4 = -1;
    }
    *result = (long)iVar4;
    this_local._7_1_ = 1;
    closure.super_SQObject._unVal.nInteger._4_4_ = 1;
  }
  else if (res.super_SQObject._unVal.nInteger._4_4_ == 0x8000010) {
    iVar4 = strcmp((char *)&((o1->super_SQObject)._unVal.pOuter)->_idx,
                   (char *)&((o2->super_SQObject)._unVal.pOuter)->_idx);
    *result = (long)iVar4;
    this_local._7_1_ = 1;
    closure.super_SQObject._unVal.nInteger._4_4_ = 1;
  }
  else {
    if ((((res.super_SQObject._unVal.nInteger._4_4_ == 0xa000020) ||
         (res.super_SQObject._unVal.nInteger._4_4_ == 0xa000080)) ||
        (res.super_SQObject._unVal.nInteger._4_4_ == 0xa008000)) &&
       ((((o1->super_SQObject)._unVal.pTable)->super_SQDelegable)._delegate != (SQTable *)0x0)) {
      ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_60);
      pSVar2 = (o1->super_SQObject)._unVal.pTable;
      uVar5 = (*(pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                _vptr_SQRefCounted[6])(pSVar2,this,10,local_60);
      if ((uVar5 & 1) == 0) {
        closure.super_SQObject._unVal.nInteger._4_4_ = 0;
      }
      else {
        Push(this,o1);
        Push(this,o2);
        bVar3 = CallMetaMethod(this,(SQObjectPtr *)local_60,MT_CMP,2,(SQObjectPtr *)local_48);
        if (bVar3) {
          if (local_48._0_4_ == OT_INTEGER) {
            *result = res.super_SQObject._0_8_;
            this_local._7_1_ = 1;
            closure.super_SQObject._unVal.nInteger._4_4_ = 1;
          }
          else {
            Raise_Error(this,"_cmp must return an integer");
            this_local._7_1_ = 0;
            closure.super_SQObject._unVal.nInteger._4_4_ = 1;
          }
        }
        else {
          this_local._7_1_ = 0;
          closure.super_SQObject._unVal.nInteger._4_4_ = 1;
        }
      }
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_60);
      if (closure.super_SQObject._unVal.nInteger._4_4_ != 0) goto LAB_00138def;
    }
    iVar4 = 1;
    if ((o1->super_SQObject)._unVal.pTable < (o2->super_SQObject)._unVal.pTable) {
      iVar4 = -1;
    }
    *result = (long)iVar4;
    this_local._7_1_ = 1;
    closure.super_SQObject._unVal.nInteger._4_4_ = 1;
  }
LAB_00138def:
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_48);
LAB_00138f64:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SQVM::ObjCmp(const SQObjectPtr &o1,const SQObjectPtr &o2,SQInteger &result)
{
    SQObjectType t1 = type(o1), t2 = type(o2);
    if(t1 == t2) {
        if(_rawval(o1) == _rawval(o2))_RET_SUCCEED(0);
        SQObjectPtr res;
        switch(t1){
        case OT_STRING:
            _RET_SUCCEED(scstrcmp(_stringval(o1),_stringval(o2)));
        case OT_INTEGER:
            _RET_SUCCEED((_integer(o1)<_integer(o2))?-1:1);
        case OT_FLOAT:
            _RET_SUCCEED((_float(o1)<_float(o2))?-1:1);
        case OT_TABLE:
        case OT_USERDATA:
        case OT_INSTANCE:
            if(_delegable(o1)->_delegate) {
                SQObjectPtr closure;
                if(_delegable(o1)->GetMetaMethod(this, MT_CMP, closure)) {
                    Push(o1);Push(o2);
                    if(CallMetaMethod(closure,MT_CMP,2,res)) {
                        if(type(res) != OT_INTEGER) {
                            Raise_Error(_SC("_cmp must return an integer"));
                            return false;
                        }
                        _RET_SUCCEED(_integer(res))
                    }
                    return false;
                }
            }
            //continues through (no break needed)
        default:
            _RET_SUCCEED( _userpointer(o1) < _userpointer(o2)?-1:1 );
        }
        assert(0);
        //if(type(res)!=OT_INTEGER) { Raise_CompareError(o1,o2); return false; }
        //  _RET_SUCCEED(_integer(res));

    }
    else{
        if(sq_isnumeric(o1) && sq_isnumeric(o2)){
            if((t1==OT_INTEGER) && (t2==OT_FLOAT)) {
                if( _integer(o1)==_float(o2) ) { _RET_SUCCEED(0); }
                else if( _integer(o1)<_float(o2) ) { _RET_SUCCEED(-1); }
                _RET_SUCCEED(1);
            }
            else{
                if( _float(o1)==_integer(o2) ) { _RET_SUCCEED(0); }
                else if( _float(o1)<_integer(o2) ) { _RET_SUCCEED(-1); }
                _RET_SUCCEED(1);
            }
        }
        else if(t1==OT_NULL) {_RET_SUCCEED(-1);}
        else if(t2==OT_NULL) {_RET_SUCCEED(1);}
        else { Raise_CompareError(o1,o2); return false; }

    }
    assert(0);
    _RET_SUCCEED(0); //cannot happen
}